

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cpp
# Opt level: O0

ParseSignalsStatus __thiscall
Libdbc::Message::parse_signals
          (Message *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *data,
          vector<double,_std::allocator<double>_> *values)

{
  bool bVar1;
  byte *pbVar2;
  ulong uVar3;
  reference pSVar4;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_RSI;
  long in_RDI;
  int64_t nativeInt;
  bool is_negative;
  uint32_t start_bit;
  Signal *signal;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_> *__range1;
  uint64_t value;
  size_type len;
  size_t i;
  uint64_t data_big_endian;
  uint64_t data_little_endian;
  size_type size;
  vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_> *in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff30;
  uint32_t in_stack_ffffffffffffff34;
  __normal_iterator<const_Libdbc::Signal_*,_std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>_>
  local_60;
  long local_58;
  ulong local_50;
  long local_48;
  ulong local_40;
  ulong local_38;
  ulong local_30;
  ulong local_28;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_18;
  ParseSignalsStatus local_4;
  
  local_18 = in_RSI;
  local_28 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(in_RSI);
  if (local_28 < 9) {
    local_30 = 0;
    local_38 = 0;
    for (local_40 = 0; local_40 < local_28; local_40 = local_40 + 1) {
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_18,local_40);
      local_30 = (ulong)*pbVar2 << ((byte)(local_40 << 3) & 0x3f) | local_30;
      uVar3 = local_38 << 8;
      pbVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (local_18,local_40);
      local_38 = uVar3 | *pbVar2;
    }
    local_48 = local_28 << 3;
    local_50 = 0;
    local_58 = in_RDI + 0x58;
    local_60._M_current =
         (Signal *)
         std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>::begin
                   (in_stack_ffffffffffffff28);
    std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>::end(in_stack_ffffffffffffff28);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<const_Libdbc::Signal_*,_std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>_>
                               *)CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                              (__normal_iterator<const_Libdbc::Signal_*,_std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>_>
                               *)in_stack_ffffffffffffff28), bVar1) {
      pSVar4 = __gnu_cxx::
               __normal_iterator<const_Libdbc::Signal_*,_std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>_>
               ::operator*(&local_60);
      if ((pSVar4->is_bigendian & 1U) == 0) {
        local_50 = local_30 >> ((byte)pSVar4->start_bit & 0x3f);
      }
      else {
        local_50 = (local_38 <<
                   (((byte)pSVar4->start_bit & 0xf8) + ('\a' - ((byte)pSVar4->start_bit & 7)) & 0x3f
                   )) >> ((char)local_48 - (char)pSVar4->size & 0x3fU);
      }
      if (((pSVar4->is_signed & 1U) == 0) || (pSVar4->size < 2)) {
        local_50 = local_50 & (long)((1 << ((byte)pSVar4->size & 0x1f)) + -1);
        std::vector<double,_std::allocator<double>_>::push_back
                  ((vector<double,_std::allocator<double>_> *)
                   CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                   (value_type_conflict2 *)in_stack_ffffffffffffff28);
      }
      else {
        in_stack_ffffffffffffff34 = pSVar4->size;
        if (in_stack_ffffffffffffff34 == 8) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(8,in_stack_ffffffffffffff30),
                     (value_type_conflict2 *)in_stack_ffffffffffffff28);
        }
        else if (in_stack_ffffffffffffff34 == 0x10) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(0x10,in_stack_ffffffffffffff30),
                     (value_type_conflict2 *)in_stack_ffffffffffffff28);
        }
        else if (in_stack_ffffffffffffff34 == 0x20) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(0x20,in_stack_ffffffffffffff30),
                     (value_type_conflict2 *)in_stack_ffffffffffffff28);
        }
        else if (in_stack_ffffffffffffff34 == 0x40) {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(0x40,in_stack_ffffffffffffff30),
                     (value_type_conflict2 *)in_stack_ffffffffffffff28);
        }
        else {
          std::vector<double,_std::allocator<double>_>::push_back
                    ((vector<double,_std::allocator<double>_> *)
                     CONCAT44(in_stack_ffffffffffffff34,in_stack_ffffffffffffff30),
                     (value_type_conflict2 *)in_stack_ffffffffffffff28);
        }
      }
      __gnu_cxx::
      __normal_iterator<const_Libdbc::Signal_*,_std::vector<Libdbc::Signal,_std::allocator<Libdbc::Signal>_>_>
      ::operator++(&local_60);
    }
    local_4 = Success;
  }
  else {
    local_4 = ErrorMessageToLong;
  }
  return local_4;
}

Assistant:

Message::ParseSignalsStatus Message::parse_signals(const std::vector<uint8_t>& data, std::vector<double>& values) const {
	auto size = data.size();
	if (size > ONE_BYTE) {
		return ParseSignalsStatus::ErrorMessageToLong; // not supported yet
	}

	uint64_t data_little_endian = 0;
	uint64_t data_big_endian = 0;
	for (std::size_t i = 0; i < size; i++) {
		data_little_endian |= ((uint64_t)data[i]) << i * ONE_BYTE;
		data_big_endian = (data_big_endian << ONE_BYTE) | (uint64_t)data[i];
	}

	// TODO: does this also work on a big endian machine?

	const auto len = size * 8;
	uint64_t value = 0;
	for (const auto& signal : m_signals) {
		if (signal.is_bigendian) {
			uint32_t start_bit = ONE_BYTE * (signal.start_bit / ONE_BYTE) + (SEVEN_BITS - (signal.start_bit % ONE_BYTE)); // Calculation taken from python CAN
			value = data_big_endian << start_bit;
			value = value >> (len - signal.size);
		} else {
			value = data_little_endian >> signal.start_bit;
		}

		if (signal.is_signed && signal.size > 1) {
			switch (signal.size) {
			case ONE_BYTE:
				values.push_back(static_cast<int8_t>(value) * signal.factor + signal.offset);
				break;
			case TWO_BYTES:
				values.push_back(static_cast<int16_t>(value) * signal.factor + signal.offset);
				break;
			case FOUR_BYTES:
				values.push_back(static_cast<int32_t>(value) * signal.factor + signal.offset);
				break;
			case EIGHT_BYTES:
				values.push_back(static_cast<double>(value) * signal.factor + signal.offset);
				break;
			default: {
				// 2 complement -> decimal
				const bool is_negative = (value & (1ULL << (signal.size - 1))) != 0;
				int64_t nativeInt = 0;
				if (is_negative) {
					nativeInt = static_cast<int64_t>(value | ~((1ULL << signal.size) - 1)); // invert all bits above signal.size
				} else {
					nativeInt = static_cast<int64_t>(value & ((1ULL << signal.size) - 1)); // masking
				}
				values.push_back(static_cast<double>(nativeInt) * signal.factor + signal.offset);
				break;
			}
			}
		} else {
			// use only the relevant bits
			value = value & ((1 << signal.size) - 1); // masking
			values.push_back(static_cast<double>(value) * signal.factor + signal.offset);
		}
	}
	return ParseSignalsStatus::Success;
}